

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BandedAlign.h
# Opt level: O2

int __thiscall
BandedAlign<Protein>::Align
          (BandedAlign<Protein> *this,Sequence<Protein> *A,Sequence<Protein> *B,Cigar *cigar,
          AlignmentDirection dir,size_t startA,size_t startB,size_t endA,size_t endB)

{
  Gaps *pGVar1;
  int *piVar2;
  pointer piVar3;
  pointer pGVar4;
  char cVar5;
  char cVar6;
  CigarOp CVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  CigarOp CVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  Gap *pGVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [4];
  size_t remainingA;
  long lVar23;
  size_t sVar24;
  size_t remainingB;
  size_t sVar25;
  bool bVar26;
  undefined4 uVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar30;
  undefined1 auVar31 [16];
  ulong local_108;
  ulong local_f0;
  undefined1 local_d8 [8];
  CigarOp op;
  ulong local_c8;
  ulong local_c0;
  CigarOps *local_b8;
  size_t local_b0;
  ulong local_a8;
  ulong local_a0;
  undefined1 local_98 [4];
  bool local_94;
  Gap horizontalGap;
  size_t local_80;
  allocator_type local_34;
  bool local_33;
  byte local_32;
  byte local_31;
  
  uVar14 = (A->sequence)._M_string_length;
  uVar21 = (B->sequence)._M_string_length;
  uVar20 = 0;
  uVar17 = 0;
  if (dir == Forward) {
    uVar20 = uVar21;
    uVar17 = uVar14;
  }
  if (endA != 0xffffffffffffffff) {
    uVar17 = endA;
  }
  if (endB != 0xffffffffffffffff) {
    uVar20 = endB;
  }
  local_a8 = startA;
  if (uVar14 < startA) {
    local_a8 = uVar14;
  }
  local_a0 = startB;
  if (uVar21 < startB) {
    local_a0 = uVar21;
  }
  uVar15 = uVar14;
  if (uVar17 < uVar14) {
    uVar15 = uVar17;
  }
  local_c8 = uVar21;
  if (uVar20 < uVar21) {
    local_c8 = uVar20;
  }
  local_c0 = local_a8 - uVar15;
  if (startA < uVar15) {
    local_c0 = uVar15 - local_a8;
  }
  uVar13 = local_a0 - local_c8;
  if (startB < local_c8) {
    uVar13 = local_c8 - local_a0;
  }
  uVar12 = local_c0 + 1;
  uVar29 = (undefined4)(uVar12 >> 0x20);
  if ((ulong)((long)(this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage -
              (long)(this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) < uVar12) {
    auVar27._8_4_ = uVar29;
    auVar27._0_8_ = uVar12;
    auVar27._12_4_ = 0x45300000;
    dVar30 = ((auVar27._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0)) * 1.5;
    uVar8 = (ulong)dVar30;
    local_d8._0_4_ = 0xc0000000;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_98,
               (long)(dVar30 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8,
               (value_type_conflict4 *)local_d8,&local_34);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&this->mScores,(_Vector_base<int,_std::allocator<int>_> *)local_98);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_98);
    local_108 = uVar12;
  }
  uVar8 = uVar13 + 1;
  pGVar1 = &this->mVerticalGaps;
  if ((ulong)((long)(this->mVerticalGaps).
                    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)(this->mVerticalGaps).
                    super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) < uVar12) {
    auVar31._8_4_ = uVar29;
    auVar31._0_8_ = uVar12;
    auVar31._12_4_ = 0x45300000;
    dVar30 = ((auVar31._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0)) * 1.5;
    uVar9 = (ulong)dVar30;
    _op = &this->mParams;
    local_d8._0_4_ = 0xc0000000;
    local_d8[4] = false;
    std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::vector
              ((vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_> *)
               local_98,(long)(dVar30 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9,
               (value_type *)local_d8,(allocator_type *)&local_34);
    std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::
    _M_move_assign(pGVar1,local_98);
    std::_Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::
    ~_Vector_base((_Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
                   *)local_98);
  }
  local_b8 = &this->mOperations;
  uVar9 = uVar8 * uVar12;
  if ((ulong)((long)(this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)(this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl
                   .super__Vector_impl_data._M_start) < uVar9) {
    auVar28._8_4_ = (int)(uVar9 >> 0x20);
    auVar28._0_8_ = uVar9;
    auVar28._12_4_ = 0x45300000;
    dVar30 = ((auVar28._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) * 1.5;
    uVar9 = (ulong)dVar30;
    std::vector<CigarOp,_std::allocator<CigarOp>_>::vector
              ((vector<CigarOp,_std::allocator<CigarOp>_> *)local_98,
               (long)(dVar30 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9,
               (allocator_type *)local_d8);
    std::vector<CigarOp,_std::allocator<CigarOp>_>::_M_move_assign
              (local_b8,(_Vector_base<CigarOp,_std::allocator<CigarOp>_> *)local_98);
    std::_Vector_base<CigarOp,_std::allocator<CigarOp>_>::~_Vector_base
              ((_Vector_base<CigarOp,_std::allocator<CigarOp>_> *)local_98);
  }
  bVar26 = local_a8 == 0;
  piVar2 = (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_32 = uVar14 <= uVar17 || uVar15 == 0;
  local_b0 = (this->mParams).bandwidth;
  *piVar2 = 0;
  local_31 = uVar21 <= uVar20 || local_c8 == 0;
  pGVar16 = (this->mVerticalGaps).
            super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pGVar16->mScore = -0x40000000;
  pGVar16->mIsTerminal = false;
  Gap::OpenOrExtend(pGVar16,*piVar2,uVar21 <= startB || local_a0 == 0,1);
  local_98 = (undefined1  [4])0xc0000000;
  local_94 = false;
  lVar23 = 0x14;
  horizontalGap._0_8_ = &this->mParams;
  for (uVar21 = 1; uVar21 < uVar12; uVar21 = uVar21 + 1) {
    piVar3 = (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((local_b0 < uVar21) && (1 < uVar8)) {
      piVar3[uVar21] = -0x40000000;
      pGVar4 = (pGVar1->
               super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)((long)pGVar4 + lVar23 + -4) = 0xc0000000;
      *(undefined1 *)((long)&pGVar4->mScore + lVar23) = 0;
      break;
    }
    Gap::OpenOrExtend((Gap *)local_98,piVar3[uVar21 - 1],uVar14 <= startA || bVar26,1);
    (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar21] = (int)local_98;
    (this->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_start[uVar21] = Insertion;
    pGVar4 = (this->mVerticalGaps).
             super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)pGVar4 + lVar23 + -4) = 0xc0000000;
    *(undefined1 *)((long)&pGVar4->mScore + lVar23) = 0;
    lVar23 = lVar23 + 0x10;
  }
  lVar23 = local_a8 - 1;
  lVar10 = local_a0 - 1;
  uVar14 = 1;
  bVar26 = false;
  local_f0 = uVar12;
  while( true ) {
    uVar17 = 0;
    if (local_b0 <= uVar14) {
      uVar17 = uVar14 - local_b0;
    }
    if (local_c0 < uVar17) {
      uVar17 = local_c0;
    }
    sVar25 = uVar8 - uVar14;
    if ((uVar8 < uVar14 || sVar25 == 0) || (bVar26)) break;
    uVar20 = 0;
    if (local_b0 <= uVar14) {
      uVar20 = uVar14 - local_b0;
    }
    if (local_c0 < uVar20) {
      uVar20 = local_c0;
    }
    uVar15 = uVar14 + local_b0;
    if (local_c0 < uVar14 + local_b0) {
      uVar15 = local_c0;
    }
    auVar22 = (undefined1  [4])0xc0000000;
    iVar19 = -0x40000000;
    if (uVar20 != 0) {
      piVar3 = (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar19 = piVar3[uVar20 - 1];
      piVar3[uVar20 - 1] = -0x40000000;
      pGVar4 = (this->mVerticalGaps).
               super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pGVar4[uVar20 - 1].mScore = -0x40000000;
      pGVar4[uVar20 - 1].mIsTerminal = false;
    }
    local_80 = local_a8 - uVar17;
    lVar18 = uVar17 << 4;
    local_98 = (undefined1  [4])0xc0000000;
    local_94 = false;
    sVar25 = local_a0 - uVar14;
    if (dir == Forward) {
      sVar25 = lVar10 + uVar14;
    }
    local_33 = (bool)(uVar14 == uVar13 & local_31);
    for (uVar21 = uVar20; uVar21 <= uVar15; uVar21 = uVar21 + 1) {
      if (uVar21 != 0) {
        sVar24 = lVar23 + uVar21;
        if (dir != Forward) {
          sVar24 = local_80;
        }
        cVar5 = Sequence<Protein>::operator[](A,sVar24);
        local_c8 = uVar21;
        cVar6 = Sequence<Protein>::operator[](B,sVar25);
        local_108 = (ulong)('\x03' < "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                                     [(long)cVar6 + (long)cVar5 * 0x1a + 0x15]);
        cVar5 = Sequence<Protein>::operator[](A,sVar24);
        uVar21 = local_c8;
        cVar6 = Sequence<Protein>::operator[](B,sVar25);
        auVar22 = (undefined1  [4])
                  (iVar19 + "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                            [(long)cVar6 + (long)cVar5 * 0x1a + 0x15]);
      }
      if ((int)auVar22 <= (int)local_98) {
        auVar22 = local_98;
      }
      piVar3 = (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pGVar4 = (this->mVerticalGaps).
               super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar19 = *(int *)((long)&pGVar4->mScore + lVar18);
      if ((int)auVar22 <= iVar19) {
        auVar22 = (undefined1  [4])iVar19;
      }
      pGVar16 = (Gap *)((long)&pGVar4->mScore + lVar18);
      iVar19 = piVar3[uVar21];
      piVar3[uVar21] = (int)auVar22;
      CVar7 = Insertion;
      if (auVar22 != local_98) {
        CVar11 = Match;
        if ((local_108 & 1) == 0) {
          CVar11 = Mismatch;
        }
        CVar7 = Deletion;
        if (auVar22 != (undefined1  [4])pGVar16->mScore) {
          CVar7 = CVar11;
        }
      }
      (local_b8->super__Vector_base<CigarOp,_std::allocator<CigarOp>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar21 + local_f0] = CVar7;
      bVar26 = (bool)((local_c0 == uVar21 || uVar21 == 0) & local_32);
      Gap::OpenOrExtend((Gap *)local_98,(int)auVar22,local_33,1);
      Gap::OpenOrExtend(pGVar16,(int)auVar22,bVar26,1);
      lVar18 = lVar18 + 0x10;
      local_80 = local_80 - 1;
    }
    uVar17 = uVar15 + 1;
    if (uVar17 < uVar12) {
      (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar15 + 1] = -0x40000000;
      pGVar4 = (this->mVerticalGaps).
               super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pGVar4[uVar17].mScore = -0x40000000;
      pGVar4[uVar17].mIsTerminal = false;
    }
    bVar26 = uVar15 == uVar20;
    uVar14 = uVar14 + 1;
    local_f0 = local_f0 + uVar12;
  }
  lVar23 = uVar21 - 1;
  if (cigar != (Cigar *)0x0) {
    lVar10 = uVar14 - 1;
    std::deque<CigarEntry,_std::allocator<CigarEntry>_>::clear
              (&cigar->super_deque<CigarEntry,_std::allocator<CigarEntry>_>);
    lVar18 = lVar23;
LAB_00182378:
    if (lVar18 != 0 || lVar10 != 0) {
      local_d8[0] = (local_b8->super__Vector_base<CigarOp,_std::allocator<CigarOp>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar18 + lVar10 * uVar12];
      Cigar::Add(cigar,local_d8);
      if ((local_d8._0_4_ & 0xff) == 0x3d) {
LAB_001823c8:
        lVar18 = lVar18 + -1;
      }
      else if ((local_d8._0_4_ & 0xff) != 0x44) {
        if ((local_d8._0_4_ & 0xff) == 0x58) goto LAB_001823c8;
        if ((local_d8._0_4_ & 0xff) == 0x49) {
          lVar18 = lVar18 + -1;
        }
        goto LAB_00182378;
      }
      lVar10 = lVar10 + -1;
      goto LAB_00182378;
    }
    Cigar::Reverse(cigar);
  }
  auVar22 = (undefined1  [4])
            (this->mScores).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar21 - 1];
  sVar24 = uVar12 - uVar21;
  if (sVar24 == 0) {
    pGVar4 = (pGVar1->
             super__Vector_base<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>
             )._M_impl.super__Vector_impl_data._M_start;
    Gap::OpenOrExtend(pGVar4 + lVar23,(int)auVar22,pGVar4[lVar23].mIsTerminal,sVar25);
    auVar22 = (undefined1  [4])pGVar4[lVar23].mScore;
    if ((cigar == (Cigar *)0x0) || (uVar8 == uVar14)) goto LAB_00182483;
    local_d8._0_4_ = (undefined4)sVar25;
    local_d8[4] = true;
  }
  else {
    if (uVar8 != uVar14) goto LAB_00182483;
    Gap::OpenOrExtend((Gap *)local_98,(int)auVar22,local_94,sVar24);
    if (cigar == (Cigar *)0x0) {
      return (int)local_98;
    }
    local_d8._0_4_ = (undefined4)sVar24;
    local_d8[4] = true;
    auVar22 = local_98;
  }
  Cigar::Add(cigar,(CigarEntry *)local_d8);
LAB_00182483:
  if (dir == Reverse && cigar != (Cigar *)0x0) {
    Cigar::Reverse(cigar);
  }
  return (int)auVar22;
}

Assistant:

int Align( const Sequence< Alphabet >& A, const Sequence< Alphabet >& B,
             Cigar*                   cigar = NULL,
             const AlignmentDirection dir   = AlignmentDirection::Forward,
             size_t startA = 0, size_t startB = 0, size_t endA = -1,
             size_t endB = -1 ) {
    // Calculate matrix width, depending on alignment
    // direction and length of sequences
    // A will be on the X axis (width of matrix)
    // B will be on the Y axis (height of matrix)
    size_t width, height;

    size_t lenA = A.Length();
    size_t lenB = B.Length();

    if( endA == ( size_t ) -1 ) {
      endA = ( dir == AlignmentDirection::Forward ? lenA : 0 );
    }

    if( endB == ( size_t ) -1 ) {
      endB = ( dir == AlignmentDirection::Forward ? lenB : 0 );
    }

    if( startA > lenA )
      startA = lenA;
    if( startB > lenB )
      startB = lenB;
    if( endA > lenA )
      endA = lenA;
    if( endB > lenB )
      endB = lenB;

    width  = ( endA > startA ? endA - startA : startA - endA ) + 1;
    height = ( endB > startB ? endB - startB : startB - endB ) + 1;

    // Make sure we have enough cells
    if( mScores.capacity() < width ) {
      mScores = Scores( width * 1.5, MinInt() );
    }

    if( mVerticalGaps.capacity() < width ) {
      mVerticalGaps = Gaps( width * 1.5, mParams );
    }

    if( mOperations.capacity() < width * height ) {
      mOperations = CigarOps( width * height * 1.5 );
    }

    // Initialize first row
    size_t bw = mParams.bandwidth;

    bool fromBeginningA = ( startA == 0 || startA == lenA );
    bool fromBeginningB = ( startB == 0 || startB == lenB );

    bool fromEndA = ( endA == 0 || endA == lenA );
    bool fromEndB = ( endB == 0 || endB == lenB );

    mScores[ 0 ] = 0;

    mVerticalGaps[ 0 ].Reset();
    mVerticalGaps[ 0 ].OpenOrExtend( mScores[ 0 ], fromBeginningB );

    Gap horizontalGap( mParams );

    size_t x, y;
    for( x = 1; x < width; x++ ) {
      if( x > bw && height > 1 ) // only break on BW bound if B is not empty
        break;

      horizontalGap.OpenOrExtend( mScores[ x - 1 ], fromBeginningA );
      mScores[ x ]     = horizontalGap.Score();
      mOperations[ x ] = CigarOp::Insertion;
      mVerticalGaps[ x ].Reset();
    }
    if( x < width ) {
      mScores[ x ] = MinInt();
      mVerticalGaps[ x ].Reset();
    }
    /* PrintRow( width ); */

    // Row by row...
    size_t center = 1;
    bool   hitEnd = false;
    for( y = 1; y < height && !hitEnd; y++ ) {
      int score = MinInt();

      // Calculate band bounds
      size_t leftBound =
        std::min( center > bw ? ( center - bw ) : 0, width - 1 );
      size_t rightBound = std::min( center + bw, width - 1 );

      // Set diagonal score for first calculated cell in row
      int diagScore = MinInt();
      if( leftBound > 0 ) {
        diagScore                = mScores[ leftBound - 1 ];
        mScores[ leftBound - 1 ] = MinInt();
        mVerticalGaps[ leftBound - 1 ].Reset();
      }

      // Calculate row within the band bounds
      horizontalGap.Reset();
      for( x = leftBound; x <= rightBound; x++ ) {
        // Calculate diagonal score
        size_t aIdx = 0, bIdx = 0;
        bool   match;
        if( x > 0 ) {
          aIdx =
            ( dir == AlignmentDirection::Forward ) ? startA + x - 1 : startA - x;
          bIdx =
            ( dir == AlignmentDirection::Forward ) ? startB + y - 1 : startB - y;
          // diagScore: score at col-1, row-1
          match = MatchPolicy< Alphabet >::Match( A[ aIdx ], B[ bIdx ] );
          score = diagScore + ScorePolicy< Alphabet >::Score( A[ aIdx ], B[ bIdx ] );
        }

        // Select highest score
        //  - coming from diag (current),
        //  - coming from left (row)
        //  - coming from top (col)
        if( score < horizontalGap.Score() )
          score = horizontalGap.Score();

        Gap& verticalGap = mVerticalGaps[ x ];
        if( score < verticalGap.Score() )
          score = verticalGap.Score();

        // Save the prev score at (x - 1) which
        // we will use to compute the diagonal score at (x)
        diagScore = mScores[ x ];

        // Save new score
        mScores[ x ] = score;

        CigarOp op;
        if( score == horizontalGap.Score() ) {
          op = CigarOp::Insertion;
        } else if( score == verticalGap.Score() ) {
          op = CigarOp::Deletion;
        } else {
          op = match ? CigarOp::Match : CigarOp::Mismatch;
        }
        mOperations[ y * width + x ] = op;

        // Calculate potential gaps
        bool isTerminalA = ( x == 0 || x == width - 1 ) && fromEndA;
        bool isTerminalB = ( y == 0 || y == height - 1 ) && fromEndB;

        horizontalGap.OpenOrExtend( score, isTerminalB );
        verticalGap.OpenOrExtend( score, isTerminalA );
      }

      if( rightBound + 1 < width ) {
        mScores[ rightBound + 1 ] = MinInt();
        mVerticalGaps[ rightBound + 1 ].Reset();
      }

      hitEnd = ( rightBound == leftBound );

      /* PrintRow( width ); */

      // Move one cell over for the next row
      center++;
    }

    // Backtrack
    if( cigar ) {
      size_t bx = x - 1;
      size_t by = y - 1;

      CigarEntry ce;
      cigar->Clear();
      while( bx != 0 || by != 0 ) {
        CigarOp op = mOperations[ by * width + bx ];
        cigar->Add( op );

        switch( op ) {
          case CigarOp::Insertion:
            bx--;
            break;
          case CigarOp::Deletion:
            by--;
            break;
          case CigarOp::Match:
            bx--;
            by--;
            break;
          case CigarOp::Mismatch:
            bx--;
            by--;
            break;
          default:
            assert( true );
            break;
        }
      }

      cigar->Reverse();
    }

    // Calculate score & cut corners
    int score = mScores[ x - 1 ];
    if( x == width ) {
      // We reached the end of A, emulate going down on B (vertical gaps)
      size_t remainingB  = height - y;
      Gap&   verticalGap = mVerticalGaps[ x - 1 ];
      verticalGap.OpenOrExtend( score, verticalGap.IsTerminal(), remainingB );
      score = verticalGap.Score();

      // Add tails to backtrack info
      if( cigar && remainingB ) {
        cigar->Add( CigarEntry( remainingB, CigarOp::Deletion ) );
      }
    } else if( y == height ) {
      // We reached the end of B, emulate going down on A (horizontal gaps)
      size_t remainingA = width - x;
      horizontalGap.OpenOrExtend( score, horizontalGap.IsTerminal(),
                                  remainingA );
      score = horizontalGap.Score();

      // Add tails to backtrack info
      if( cigar && remainingA ) {
        cigar->Add( CigarEntry( remainingA, CigarOp::Insertion ) );
      }
    }

    if( cigar && dir == AlignmentDirection::Reverse ) {
      cigar->Reverse();
    }

    return score;
  }